

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar
          (InterfaceVariableScalarReplacement *this,Instruction *var)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  Instruction *this_01;
  
  if (var->opcode_ != OpVariable) {
    __assert_fail("var->opcode() == spv::Op::OpVariable",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x254,
                  "uint32_t spvtools::opt::InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar(Instruction *)"
                 );
  }
  uVar1 = Instruction::type_id(var);
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  this_01 = analysis::DefUseManager::GetDef(this_00,uVar1);
  if (this_01->opcode_ == OpTypePointer) {
    uVar1 = Instruction::GetSingleWordInOperand(this_01,1);
    return uVar1;
  }
  __assert_fail("ptr_type_inst->opcode() == spv::Op::OpTypePointer && \"Variable must have a pointer type.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                ,0x25b,
                "uint32_t spvtools::opt::InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar(Instruction *)"
               );
}

Assistant:

uint32_t InterfaceVariableScalarReplacement::GetPointeeTypeIdOfVar(
    Instruction* var) {
  assert(var->opcode() == spv::Op::OpVariable);

  uint32_t ptr_type_id = var->type_id();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  Instruction* ptr_type_inst = def_use_mgr->GetDef(ptr_type_id);

  assert(ptr_type_inst->opcode() == spv::Op::OpTypePointer &&
         "Variable must have a pointer type.");
  return ptr_type_inst->GetSingleWordInOperand(kOpTypePtrTypeInOperandIndex);
}